

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeT2AddrModeImm8s4(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  int64_t Val_00;
  
  MCOperand_CreateReg0(Inst,(uint)*(ushort *)((long)GPRDecoderTable + (ulong)(Val >> 8 & 0x1e)));
  if ((Val & 0x1ff) == 0) {
    Val_00 = -0x80000000;
  }
  else {
    uVar1 = -(Val & 0xff);
    if ((Val >> 8 & 1) != 0) {
      uVar1 = Val & 0xff;
    }
    Val_00 = (int64_t)(int)(uVar1 << 2);
  }
  MCOperand_CreateImm0(Inst,Val_00);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeT2AddrModeImm8s4(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 9, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 9);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeT2Imm8S4(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}